

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O0

Optional<llvm::object::SectionedAddress> * __thiscall
llvm::function_ref<llvm::Optional<llvm::object::SectionedAddress>(unsigned_int)>::
callback_fn<llvm::DWARFContext::dump(llvm::raw_ostream&,llvm::DIDumpOptions,std::array<llvm::Optional<unsigned_long>,28ul>)::__4>
          (Optional<llvm::object::SectionedAddress> *__return_storage_ptr__,
          function_ref<llvm::Optional<llvm::object::SectionedAddress>(unsigned_int)> *this,
          intptr_t callable,uint params)

{
  uint params_local;
  intptr_t callable_local;
  
  DWARFContext::dump::anon_class_8_1_8991fb9c::operator()
            (__return_storage_ptr__,(anon_class_8_1_8991fb9c *)this,(uint32_t)callable);
  return __return_storage_ptr__;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params ...params) {
    return (*reinterpret_cast<Callable*>(callable))(
        std::forward<Params>(params)...);
  }